

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall SocketPP::TCPServer::onConnected(TCPServer *this,int fd)

{
  TCPStream stream;
  value_type local_24;
  
  printf("\x1b[33m%s: get an accept:%d\x1b[m\n","TCPServer.cpp",fd);
  std::mutex::lock(&this->streamMutex_);
  std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::push_back
            (&this->connectedStreams_,&local_24);
  pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
  printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n","TCPServer.cpp",
         (long)(this->connectedStreams_).
               super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->connectedStreams_).
               super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl
               .super__Vector_impl_data._M_start >> 2);
  if ((this->connHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_SocketPP::TCPStream_&)>::operator()(&this->connHandle_,&local_24);
  }
  return;
}

Assistant:

void TCPServer::onConnected(int fd) {
    TCPStream stream(fd);

    LOGD("get an accept:%d", stream.fd);
    streamMutex_.lock();
    connectedStreams_.push_back(stream);
    streamMutex_.unlock();

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (connHandle_)
        connHandle_(stream);
}